

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicMax::Check(BasicMax *this,GLenum e,GLint64 value,bool max_value)

{
  char *pcVar1;
  undefined7 in_register_00000009;
  long lVar2;
  int7 iVar3;
  char *format;
  CallLogWrapper *this_00;
  GLint i;
  GLboolean b;
  GLint64 i64;
  GLfloat f;
  GLdouble d;
  uint local_50;
  GLboolean local_49;
  long local_48;
  float local_3c;
  double local_38;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,e,(GLint *)&local_50);
  glu::CallLogWrapper::glGetInteger64v(this_00,e,&local_48);
  glu::CallLogWrapper::glGetFloatv(this_00,e,&local_3c);
  glu::CallLogWrapper::glGetDoublev(this_00,e,&local_38);
  glu::CallLogWrapper::glGetBooleanv(this_00,e,&local_49);
  lVar2 = (long)(int)local_50;
  iVar3 = (int7)(int3)(local_50 >> 8);
  if ((int)CONCAT71(in_register_00000009,max_value) == 0) {
    if ((((long)local_38 <= value && (long)local_3c <= value) && local_48 <= value) &&
        lVar2 <= value) {
      return true;
    }
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString
                       ((ShaderStorageBufferObjectBase *)(ulong)e,
                        (GLenum)CONCAT71(iVar3,lVar2 <= value));
    format = "%s is %d should be at most %d.\n";
  }
  else {
    if (((value <= (long)local_38 && value <= (long)local_3c) && value <= local_48) &&
        value <= lVar2) {
      return true;
    }
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString
                       ((ShaderStorageBufferObjectBase *)(ulong)e,
                        (GLenum)CONCAT71(iVar3,value <= lVar2));
    format = "%s is %d should be at least %d.\n";
  }
  anon_unknown_0::Output(format,pcVar1,(ulong)local_50,value & 0xffffffff);
  return false;
}

Assistant:

bool Check(GLenum e, GLint64 value, bool max_value)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegerv(e, &i);
		glGetInteger64v(e, &i64);
		glGetFloatv(e, &f);
		glGetDoublev(e, &d);
		glGetBooleanv(e, &b);

		bool status = true;
		if (max_value)
		{
			if (static_cast<GLint64>(i) < value)
				status = false;
			if (i64 < value)
				status = false;
			if (static_cast<GLint64>(f) < value)
				status = false;
			if (static_cast<GLint64>(d) < value)
				status = false;

			if (!status)
			{
				Output("%s is %d should be at least %d.\n", GLenumToString(e), i, static_cast<GLint>(value));
			}
		}
		else
		{
			if (static_cast<GLint64>(i) > value)
				status = false;
			if (i64 > value)
				status = false;
			if (static_cast<GLint64>(f) > value)
				status = false;
			if (static_cast<GLint64>(d) > value)
				status = false;

			if (!status)
			{
				Output("%s is %d should be at most %d.\n", GLenumToString(e), i, static_cast<GLint>(value));
			}
		}
		return status;
	}